

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O1

void __thiscall QCursor::QCursor(QCursor *this,QPixmap *pixmap,int hotX,int hotY)

{
  qreal devicePixelRatio;
  bool bVar1;
  QCursorData *pQVar2;
  long in_FS_OFFSET;
  QPixmap local_e8;
  QImage local_d0;
  undefined1 local_b8 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_a8;
  undefined1 local_98 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_88;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QCursorData *)0x0;
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage((QImage *)local_98,pixmap);
  QImage::convertToFormat
            ((QImage *)local_78,(QImage *)local_98,Format_Indexed8,(ImageConversionFlags)0xa0);
  QImage::~QImage((QImage *)local_98);
  local_88.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBitmap::fromImage((QBitmap *)local_98,(QImage *)local_78,(ImageConversionFlags)0xa0);
  local_a8.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::mask((QBitmap *)local_b8,pixmap);
  bVar1 = QPixmap::isNull((QPixmap *)local_b8);
  if (bVar1) {
    QPixmap::mask((QBitmap *)local_58,pixmap);
    bVar1 = QPixmap::isNull((QPixmap *)local_58);
    QBitmap::~QBitmap((QBitmap *)local_58);
    if (bVar1) {
      local_d0.super_QPaintDevice._vptr_QPaintDevice =
           (_func_int **)QPixmap::size((QPixmap *)local_98);
      QBitmap::QBitmap((QBitmap *)local_58,(QSize *)&local_d0);
      QPixmap::operator=((QPixmap *)local_b8,(QPixmap *)local_58);
      QBitmap::~QBitmap((QBitmap *)local_58);
      QColor::QColor((QColor *)local_58,color1);
      QPixmap::fill((QPixmap *)local_b8,(QColor *)local_58);
    }
    else {
      local_48.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::mask((QBitmap *)&local_e8,pixmap);
      QPixmap::toImage(&local_d0,&local_e8);
      QImage::convertToFormat
                ((QImage *)local_58,&local_d0,Format_Indexed8,(ImageConversionFlags)0xa0);
      QImage::~QImage(&local_d0);
      QBitmap::~QBitmap((QBitmap *)&local_e8);
      QBitmap::fromImage((QBitmap *)&local_d0,(QImage *)local_58,(ImageConversionFlags)0xa0);
      QPixmap::operator=((QPixmap *)local_b8,(QPixmap *)&local_d0);
      QBitmap::~QBitmap((QBitmap *)&local_d0);
      QImage::~QImage((QImage *)local_58);
    }
  }
  else {
    local_48.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBitmap::QBitmap((QBitmap *)local_58);
    QPixmap::setMask((QPixmap *)local_98,(QBitmap *)local_58);
    QBitmap::~QBitmap((QBitmap *)local_58);
  }
  devicePixelRatio = QPixmap::devicePixelRatio(pixmap);
  pQVar2 = QCursorData::setBitmap
                     ((QBitmap *)local_98,(QBitmap *)local_b8,hotX,hotY,devicePixelRatio);
  this->d = pQVar2;
  QPixmap::operator=(&pQVar2->pixmap,pixmap);
  QBitmap::~QBitmap((QBitmap *)local_b8);
  QBitmap::~QBitmap((QBitmap *)local_98);
  QImage::~QImage((QImage *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCursor::QCursor(const QPixmap &pixmap, int hotX, int hotY)
    : d(nullptr)
{
    QImage img = pixmap.toImage().convertToFormat(QImage::Format_Indexed8, Qt::ThresholdDither|Qt::AvoidDither);
    QBitmap bm = QBitmap::fromImage(img, Qt::ThresholdDither|Qt::AvoidDither);
    QBitmap bmm = pixmap.mask();
    if (!bmm.isNull()) {
        QBitmap nullBm;
        bm.setMask(nullBm);
    }
    else if (!pixmap.mask().isNull()) {
        QImage mimg = pixmap.mask().toImage().convertToFormat(QImage::Format_Indexed8, Qt::ThresholdDither|Qt::AvoidDither);
        bmm = QBitmap::fromImage(mimg, Qt::ThresholdDither|Qt::AvoidDither);
    }
    else {
        bmm = QBitmap(bm.size());
        bmm.fill(Qt::color1);
    }

    d = QCursorData::setBitmap(bm, bmm, hotX, hotY, pixmap.devicePixelRatio());
    d->pixmap = pixmap;
}